

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

void tinygltf::SerializeGltfBuffer(Buffer *buffer,json *o)

{
  tinygltf *this;
  tinygltf *ptVar1;
  uint in_ECX;
  string header;
  string encodedData;
  allocator local_91;
  string local_90;
  string local_70;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string((string *)&local_90,"byteLength",(allocator *)&local_70);
  SerializeNumberProperty<unsigned_long>
            (&local_90,
             (long)(buffer->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(buffer->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,o);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string
            ((string *)&local_90,"data:application/octet-stream;base64,",(allocator *)&local_70);
  this = (tinygltf *)
         (buffer->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
  ptVar1 = (tinygltf *)
           (buffer->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (ptVar1 == this) {
    std::__cxx11::string::string((string *)&local_70,"uri",(allocator *)&local_50);
    SerializeStringProperty(&local_70,&local_90,o);
  }
  else {
    base64_encode_abi_cxx11_(&local_70,this,(uchar *)(ulong)(uint)((int)ptVar1 - (int)this),in_ECX);
    std::__cxx11::string::string((string *)&local_50,"uri",&local_91);
    std::operator+(&local_30,&local_90,&local_70);
    SerializeStringProperty(&local_50,&local_30,o);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  if ((buffer->name)._M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_90,"name",(allocator *)&local_70);
    SerializeStringProperty(&local_90,&buffer->name,o);
    std::__cxx11::string::~string((string *)&local_90);
  }
  SerializeExtrasAndExtensions<tinygltf::Buffer>(buffer,o);
  return;
}

Assistant:

static void SerializeGltfBuffer(const Buffer &buffer, detail::json &o) {
  SerializeNumberProperty("byteLength", buffer.data.size(), o);
  SerializeGltfBufferData(buffer.data, o);

  if (buffer.name.size()) SerializeStringProperty("name", buffer.name, o);

  SerializeExtrasAndExtensions(buffer, o);
}